

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O2

void density_tests::heterogeneous_queue_put_samples(void)

{
  int *piVar1;
  char *pcVar2;
  put_transaction<int> put;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_3;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  put_transaction<int> local_70;
  put_transaction<void> local_58;
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  local_40;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  local_30;
  
  local_58.m_queue =
       (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0xffef;
  local_58.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_90._M_dataplus._M_p._0_4_ = 0xc;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_58,(int *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"Hello world!!",(allocator *)&local_70);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  emplace<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &local_58);
  local_90._M_dataplus._M_p._0_4_ = 0xc;
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT71(local_70.m_queue._1_7_,0x2d);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,int,char>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_58,(int *)&local_90,(char *)&local_70);
  local_40.m_head._0_4_ = 0xc;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_70,
                  (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_58,(int *)&local_40);
  local_90._M_dataplus._M_p = (pointer)local_70.m_queue;
  local_90._M_string_length = (size_type)local_70.m_put_data.m_control_block;
  local_90.field_2._M_allocated_capacity = (size_type)local_70.m_put_data.m_user_storage;
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_70);
  piVar1 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  put_transaction<int>::element_ptr((put_transaction<int> *)&local_90);
  *piVar1 = *piVar1 + 2;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)&local_90);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)&local_90);
  local_40.m_head = (ControlBlock *)CONCAT44(local_40.m_head._4_4_,4);
  local_30.m_feature_table._0_1_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<std::__cxx11::string,int,char>
            ((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_70,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_58,(int *)&local_40,(char *)&local_30);
  local_90._M_dataplus._M_p = (pointer)local_70.m_queue;
  local_90._M_string_length = (size_type)local_70.m_put_data.m_control_block;
  local_90.field_2._M_allocated_capacity = (size_type)local_70.m_put_data.m_user_storage;
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70);
  pcVar2 = (char *)density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::
                   put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::element_ptr((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_90);
  std::__cxx11::string::append(pcVar2);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::commit((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_90);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_58);
  local_90._M_dataplus._M_p = (pointer)0xffef;
  local_90._M_string_length = 0xffef;
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,int>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)&local_90,
             (runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&local_70);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_90);
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_70.m_put_data.m_control_block = (ControlBlock *)0xffef;
  std::__cxx11::string::string((string *)&local_90,"Hello world!!",(allocator *)&local_58);
  local_58.m_queue =
       (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)density::detail::
          FeatureTable<std::tuple<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
          ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_copy((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                   *)&local_70,
                  (runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                   *)&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_70);
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_70.m_put_data.m_control_block = (ControlBlock *)0xffef;
  std::__cxx11::string::string((string *)&local_90,"Hello world!!",(allocator *)&local_58);
  local_58.m_queue =
       (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)density::detail::
          FeatureTable<std::tuple<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
          ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_move((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                   *)&local_70,
                  (runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                   *)&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_70);
  local_58.m_queue =
       (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0xffef;
  local_58.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_40.m_head =
       (ControlBlock *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,int>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push((put_transaction<void> *)&local_70,
                   (heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                    *)&local_58,
                   (runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                    *)&local_40);
  local_90._M_dataplus._M_p = (pointer)local_70.m_queue;
  local_90._M_string_length = (size_type)local_70.m_put_data.m_control_block;
  local_90.field_2._M_allocated_capacity = (size_type)local_70.m_put_data.m_user_storage;
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_70);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)&local_90);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_90);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_58);
  local_40.m_head = (ControlBlock *)0xffef;
  local_40.m_tail = (ControlBlock *)0xffef;
  std::__cxx11::string::string((string *)&local_90,"Hello world!!",(allocator *)&local_70);
  local_30.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push_copy(&local_58,&local_40,&local_30,&local_90);
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       local_58.m_queue;
  local_70.m_put_data.m_control_block = local_58.m_put_data.m_control_block;
  local_70.m_put_data.m_user_storage = local_58.m_put_data.m_user_storage;
  local_58.m_queue =
       (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction(&local_58);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)&local_70);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy(&local_40);
  local_40.m_head = (ControlBlock *)0xffef;
  local_40.m_tail = (ControlBlock *)0xffef;
  std::__cxx11::string::string((string *)&local_90,"Hello world!!",(allocator *)&local_70);
  local_30.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push_move
            ((put_transaction<void> *)&local_58,
             (heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)&local_40,
             (runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&local_30,&local_90);
  local_70.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       local_58.m_queue;
  local_70.m_put_data.m_control_block = local_58.m_put_data.m_control_block;
  local_70.m_put_data.m_user_storage = local_58.m_put_data.m_user_storage;
  local_58.m_queue =
       (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_58);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)&local_70);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_40);
  return;
}

Assistant:

void heterogeneous_queue_put_samples()
    {
        using namespace density;
        {
            heter_queue<> queue;

            //! [heter_queue push example 1]
            queue.push(12);
            queue.push(std::string("Hello world!!"));
            //! [heter_queue push example 1]

            //! [heter_queue emplace example 1]
            queue.emplace<int>();
            queue.emplace<std::string>(12, '-');
            //! [heter_queue emplace example 1]

            {
                //! [heter_queue start_push example 1]
                auto put = queue.start_push(12);
                put.element() += 2;
                put.commit(); // commits a 14
                //! [heter_queue start_push example 1]
            }
            {
                //! [heter_queue start_emplace example 1]
                auto put = queue.start_emplace<std::string>(4, '*');
                put.element() += "****";
                put.commit(); // commits a "********"
                //! [heter_queue start_emplace example 1]
            }
        }
        {
            //! [heter_queue dyn_push example 1]
            using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            auto const type = MyRunTimeType::make<int>();
            queue.dyn_push(type); // appends 0
            //! [heter_queue dyn_push example 1]
        }
        {
            //! [heter_queue dyn_push_copy example 1]
            using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string const source("Hello world!!");
            auto const        type = MyRunTimeType::make<decltype(source)>();
            queue.dyn_push_copy(type, &source);
            //! [heter_queue dyn_push_copy example 1]
        }
        {
            //! [heter_queue dyn_push_move example 1]
            using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string source("Hello world!!");
            auto const  type = MyRunTimeType::make<decltype(source)>();
            queue.dyn_push_move(type, &source);
            //! [heter_queue dyn_push_move example 1]
        }

        {
            //! [heter_queue start_dyn_push example 1]
            using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            auto const type = MyRunTimeType::make<int>();
            auto       put  = queue.start_dyn_push(type);
            put.commit();
            //! [heter_queue start_dyn_push example 1]
        }
        {
            //! [heter_queue start_dyn_push_copy example 1]
            using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string const source("Hello world!!");
            auto const        type = MyRunTimeType::make<decltype(source)>();
            auto              put  = queue.start_dyn_push_copy(type, &source);
            put.commit();
            //! [heter_queue start_dyn_push_copy example 1]
        }
        {
            //! [heter_queue start_dyn_push_move example 1]
            using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string source("Hello world!!");
            auto const  type = MyRunTimeType::make<decltype(source)>();
            auto        put  = queue.start_dyn_push_move(type, &source);
            put.commit();
            //! [heter_queue start_dyn_push_move example 1]
        }
    }